

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O3

Score Search::search<(Nodetype)2>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  int *piVar1;
  Searchthread *t;
  U64 UVar2;
  double dVar3;
  Score SVar4;
  U8 UVar5;
  U8 UVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  short sVar13;
  U16 depth_00;
  int iVar14;
  long lVar15;
  ulong uVar16;
  undefined7 extraout_var;
  uint uVar17;
  undefined6 in_register_0000000a;
  ushort uVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar19;
  undefined7 uVar20;
  uint uVar21;
  Score SVar22;
  byte bVar23;
  byte bVar24;
  short sVar25;
  Score SVar26;
  Score SVar27;
  short sVar28;
  bool bVar29;
  bool bVar30;
  float __x;
  Move move;
  Score local_224;
  Move local_21e;
  Move local_21b;
  uint local_218;
  int local_214;
  uint local_210;
  U8 local_209;
  byte local_208;
  char local_207;
  byte local_206;
  bool pvNode;
  Score local_204;
  Score local_200;
  Move local_1fa;
  Move local_1f7;
  undefined4 local_1f4;
  Score local_1f0;
  Score local_1ec;
  Score bestScore;
  undefined4 local_1e4;
  uint local_1e0;
  int local_1dc;
  Score ttvalue;
  U8 local_1d3;
  U8 local_1d2;
  U8 local_1d1;
  node *local_1d0;
  ulong local_1c8;
  U64 local_1c0;
  uint local_1b8;
  Score local_1b4;
  Score local_1b0;
  int16 local_1aa;
  vector<Move,_std::allocator<Move>_> quiets;
  Moveorder mvs;
  Move pv [68];
  
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,
                  "Score Search::search(position &, int16, int16, U16, node *) [type = non_pv]");
  }
  local_218 = (uint)CONCAT62(in_register_0000000a,depth);
  SVar27 = (Score)alpha;
  bestScore = ninf;
  local_21b.f = '\0';
  local_21b.t = '\0';
  local_21b.type = '\x11';
  local_21e.f = '\0';
  local_21e.t = '\0';
  local_21e.type = '\x11';
  lVar15 = 2;
  do {
    *(undefined2 *)((long)pv + lVar15 + -2) = 0;
    (&pv[0].f)[lVar15] = '\x11';
    lVar15 = lVar15 + 3;
  } while (lVar15 != 0xce);
  ttvalue = ninf;
  bVar7 = position::in_check(pos);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  stack->in_check = bVar7;
  iVar14 = *(int *)(stack + -1);
  stack->ply = (U16)(iVar14 + 1U);
  pvNode = false;
  if (!bVar7) {
    bVar8 = position::is_draw(pos);
    SVar26 = draw;
    if (bVar8) goto LAB_0012bde8;
  }
  uVar21 = iVar14 + 1U & 0xffff;
  SVar26 = mate - uVar21;
  SVar4 = (int)beta;
  if (SVar26 < beta) {
    SVar4 = SVar26;
  }
  if (SVar26 <= SVar27) goto LAB_0012bde8;
  SVar22 = uVar21 + mated;
  local_1ec = SVar27;
  if (SVar27 < SVar22) {
    local_1ec = SVar22;
  }
  sVar28 = (short)SVar4;
  SVar27 = (Score)sVar28;
  SVar26 = SVar22;
  if (SVar27 <= SVar22) goto LAB_0012bde8;
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
       '\x11';
  local_1c0 = (pos->ifo).key;
  bVar8 = hash_table::fetch(&ttable,&local_1c0,(hash_data *)&mvs);
  SVar26 = ninf;
  uVar16 = (ulong)(ushort)local_218;
  local_1c8._0_4_ = local_218 & 0xffff;
  local_1c8 = uVar16;
  if (bVar8) {
    local_21e = mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._2_3_;
    hashHits = hashHits + 1;
    SVar26 = (Score)mvs._vptr_Moveorder._4_2_;
    ttvalue = SVar26;
    if ((int)(uint)local_1c8 <= (int)(char)mvs._vptr_Moveorder) {
      if (SVar26 < SVar27) {
        if (mvs._vptr_Moveorder._1_1_ == '\x01') {
LAB_0012b46b:
          local_1c0 = CONCAT62(local_1c0._2_6_,(ushort)local_218);
          haVoc::Movehistory::update
                    (&pos->stats,pos,&local_21e,&stack[-1].curr_move,(int16 *)&local_1c0,&ttvalue,
                     &quiets,stack->killers);
          SVar26 = ttvalue;
          goto LAB_0012bde8;
        }
      }
      else if (mvs._vptr_Moveorder._1_1_ == '\0') goto LAB_0012b46b;
    }
  }
  bVar8 = (DAT_00141b78 & (pos->pcs).bitmap._M_elems[1]._M_elems[0]) != 0;
  bVar29 = (DAT_00141ba0 & (pos->pcs).bitmap._M_elems[0]._M_elems[0]) != 0;
  local_210 = CONCAT31(local_210._1_3_,bVar8 || bVar29);
  if (SVar26 == ninf) {
    SVar26 = stack[-2].static_eval;
    if ((SVar26 != ninf && !bVar7) && (stack[-1].static_eval <= SVar26)) {
      SVar26 = SVar26 + 0xf;
      goto LAB_0012b53d;
    }
    if (!bVar7) {
      t = SearchThreads.workers.super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
          _M_impl.super__Vector_impl_data._M_start[pos->thread_id];
      if (bVar8 || bVar29) {
        mvs._vptr_Moveorder._0_4_ = -1.0;
      }
      else {
        dVar3 = (double)(uint)local_1c8;
        dVar3 = exp((dVar3 + -64.0) / 20.0);
        mvs._vptr_Moveorder._0_4_ = (float)((1.0 - dVar3) * 225.0);
      }
      __x = eval::evaluate(pos,t,(float *)&mvs);
      lVar15 = lroundf(__x);
      SVar26 = (Score)lVar15;
      stack->static_eval = SVar26;
      goto LAB_0012b59f;
    }
    stack->static_eval = ninf;
    SVar26 = ninf;
LAB_0012b5af:
    bVar8 = false;
  }
  else {
LAB_0012b53d:
    stack->static_eval = SVar26;
    if (bVar7) goto LAB_0012b5af;
LAB_0012b59f:
    if ((stack[-1].curr_move.type != '\n') || (stack->null_search != false)) goto LAB_0012b5af;
    bVar8 = (((short)(undefined2)local_1ec - SVar27) + 1U & 0xfffffffdU) == 0 && SVar26 != ninf;
  }
  bVar29 = (pos->ifo).stm != white;
  local_1f0 = SVar27;
  if ((((bVar8) && (5 < (ushort)local_218)) &&
      ((((pos->pcs).bitmap._M_elems[bVar29]._M_elems[2] != 0 ||
        (pos->pcs).bitmap._M_elems[bVar29]._M_elems[1] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar29]._M_elems[3] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar29]._M_elems[4] != 0)) &&
     (SVar27 <= SVar26 + (int)local_1c8 * 8 + 0xfffffe00)) {
    stack[1].null_search = true;
    position::do_null_move(pos);
    depth_00 = (short)local_218 - (short)(local_1c8 >> 1);
    if ((short)depth_00 < 2) {
      SVar27 = qsearch<(Nodetype)2>(pos,-sVar28,1 - sVar28,0,stack + 1);
    }
    else {
      SVar27 = search<(Nodetype)2>(pos,-sVar28,1 - sVar28,depth_00,stack + 1);
    }
    position::undo_null_move(pos);
    SVar26 = -SVar27;
    stack[1].null_search = false;
    if (local_1f0 == SVar26 || SBORROW4(local_1f0,SVar26) != local_1f0 + SVar27 < 0)
    goto LAB_0012bde8;
    if ((stack[1].best_move.type == '\v') && (499 < SVar27 + local_1f0)) {
      UVar5 = stack[1].best_move.t;
      (stack->threat_move).f = stack[1].best_move.f;
      (stack->threat_move).t = UVar5;
      (stack->threat_move).type = '\v';
    }
  }
  haVoc::Moveorder::Moveorder(&mvs,pos,&local_21e,stack);
  move.f = '\0';
  move.t = '\0';
  move.type = '\x11';
  local_1f7.f = stack[-1].curr_move.f;
  local_1f7.t = stack[-1].curr_move.t;
  local_1f7.type = stack[-1].curr_move.type;
  local_1fa.f = stack[-2].curr_move.f;
  local_1fa.t = stack[-2].curr_move.t;
  local_1fa.type = stack[-2].curr_move.type;
  local_1b0 = stack[-2].static_eval;
  local_1b4 = stack->static_eval;
  uVar16 = (ulong)(pos->ifo).stm;
  uVar21 = (uint)(pos->ifo).key & 0x3ff;
  if (searching_positions[uVar21].searching == false) {
    uVar18 = pos->thread_id;
    searching_positions[uVar21].searching = true;
    searching_positions[uVar21].id = (uint)uVar18;
  }
  bVar8 = local_1b0 <= local_1b4;
  local_204 = (Score)(short)local_1ec;
  uVar17 = (uint)local_1c8;
  local_1b8 = uVar17 * uVar17 + 6 >> (local_1b4 < local_1b0);
  local_1d0 = stack + 1;
  local_208 = (ushort)local_218 < 3 | (byte)local_210;
  uVar21 = 0x3f;
  if (uVar17 < 0x3f) {
    uVar21 = uVar17;
  }
  local_1dc = -local_1ec;
  local_1ec = ~local_1ec;
  sVar28 = -sVar28;
  local_224 = ninf;
  bVar29 = false;
  local_210 = 0;
  do {
    local_206 = (ushort)local_218 < 2 && local_224 < local_204;
    local_207 = mated_max_ply < local_224 && local_224 < local_204;
    local_200 = local_224;
    do {
      bVar9 = 1 < (ushort)local_210 & local_206;
      do {
        do {
          bVar10 = haVoc::Moveorder::next_move
                             (&mvs,pos,&move,&local_1f7,&local_1fa,&stack->threat_move,bVar29,false)
          ;
          if (!bVar10) goto LAB_0012bcb4;
          if (UCI_SIGNALS.stop != false) goto LAB_0012bd88;
        } while ((move.type == '\x11') || (bVar10 = position::is_legal(pos,&move), !bVar10));
        if ((move.f == local_21e.f) && (move.t == local_21e.t)) {
          bVar10 = true;
          if (move.type != local_21e.type) goto LAB_0012b80b;
        }
        else {
LAB_0012b80b:
          if (((((move.f != stack->killers[0].f) || (move.t != stack->killers[0].t)) ||
               (bVar10 = true, move.type != stack->killers[0].type)) &&
              (((move.f != stack->killers[1].f || (move.t != stack->killers[1].t)) ||
               (bVar10 = true, move.type != stack->killers[1].type)))) &&
             (((move.f != stack->killers[2].f || (move.t != stack->killers[2].t)) ||
              (bVar10 = true, move.type != stack->killers[2].type)))) {
            if ((move.f == stack->killers[3].f) && (move.t == stack->killers[3].t)) {
              bVar10 = move.type == stack->killers[3].type;
            }
            else {
              bVar10 = false;
            }
          }
        }
        bVar11 = position::is_promotion(pos,&move.type);
        local_214 = CONCAT31(local_214._1_3_,1);
        uVar19 = extraout_RDX;
        if (1 < (byte)(move.type - 0xb)) {
          local_1c0 = CONCAT44(local_1c0._4_4_,(uint)move.type);
          bVar12 = position::is_cap_promotion(pos,(Movetype *)&local_1c0);
          local_214 = CONCAT31(local_214._1_3_,bVar12);
          uVar19 = extraout_RDX_00;
        }
        if ((pos->pcs).piece_on._M_elems[move.t] == pawn) {
          uVar20 = (undefined7)((ulong)uVar19 >> 8);
          if (uVar16 == 0) {
            local_1f4 = (undefined4)CONCAT71(uVar20,0x27 < move.t);
          }
          else {
            local_1f4 = (undefined4)CONCAT71(uVar20,move.t < 0x18);
          }
        }
        else {
          local_1f4 = 0;
        }
        if ((stack->threat_move).type == '\x11') {
          local_1e0 = 0;
        }
        else {
          local_1e0 = (uint)((stack->threat_move).f == move.t & (byte)local_214);
        }
        local_209 = stack[-1].curr_move.type;
        if (move.type == '\n') {
          bVar12 = position::quiet_gives_dangerous_check(pos,&move);
          local_1e4 = (undefined4)CONCAT71(extraout_var,bVar12);
        }
        else {
          local_1e4 = 0;
        }
      } while (((((!bVar7 && bVar10 == false) && (byte)local_214 == '\x01') && !bVar11) &&
               (bVar9 == 1)) && (iVar14 = position::see(pos,&move), iVar14 < 0));
      bVar30 = local_209 == '\v';
      position::do_move(pos,&move);
      (stack->curr_move).f = move.f;
      (stack->curr_move).t = move.t;
      (stack->curr_move).type = move.type;
      bVar12 = position::in_check(pos);
      uVar18 = (ushort)bVar12;
      bVar23 = local_1b0 <= local_1b4 | bVar10;
      bVar24 = 2 < (ushort)local_218 | (byte)local_214;
      bVar9 = (byte)local_1f4;
      if (bVar23 == 0 && bVar24 == 0) {
        uVar18 = bVar12 + 1;
        if (((bVar9 | (byte)local_1e4 | (byte)local_1e0) & 1) == 0) {
          uVar18 = (ushort)bVar12;
        }
        if (local_207 == '\0') {
          uVar18 = (ushort)bVar12;
        }
      }
      uVar17 = local_210 & 0xffff;
      bVar29 = local_1b8 <= uVar17;
      sVar25 = uVar18 + (ushort)local_218 +
               ((byte)(((bVar11 || bVar12) || local_204 < local_200) |
                      bVar23 | bVar7 | bVar24 | bVar9) | 0xfffe);
      stack[1].pv = (Move *)0x0;
      if ((ushort)local_210 < 3) {
        stack[1].pv = pv;
        pv[0].f = '\0';
        pv[0].t = '\0';
        pv[0].type = '\x11';
        if (sVar25 < 2) {
          local_224 = qsearch<(Nodetype)1>(pos,sVar28,(short)local_1dc,0,local_1d0);
        }
        else {
          local_224 = search<(Nodetype)1>(pos,sVar28,(short)local_1dc,sVar25 - 1,local_1d0);
        }
LAB_0012bbe8:
        local_224 = -local_224;
      }
      else {
        sVar13 = sVar25;
        if ((((bVar11 | bVar9 | bVar10 | (byte)local_1e0 | (byte)local_1e4 | bVar7 | bVar12 |
              local_208) & 1) == 0 && ((byte)local_214 & bVar30) == 0) && (local_200 <= local_204))
        {
          if (0x3e < uVar17) {
            uVar17 = 0x3f;
          }
          sVar13 = sVar25 - *(short *)((long)&bitboards::reductions +
                                      (ulong)uVar17 * 4 +
                                      (ulong)(uVar21 << 8) + (ulong)bVar8 * 0x4000);
        }
        local_214 = (int)(short)local_1dc;
        if (sVar13 < 2) {
          SVar27 = qsearch<(Nodetype)2>(pos,(undefined2)local_1ec,(short)local_1dc,0,local_1d0);
        }
        else {
          SVar27 = search<(Nodetype)2>(pos,(undefined2)local_1ec,(short)local_1dc,sVar13 - 1,
                                       local_1d0);
        }
        local_224 = -SVar27;
        if (SBORROW4(local_204,local_224) != local_204 + SVar27 < 0) {
          stack[1].pv = pv;
          pv[0].f = '\0';
          pv[0].t = '\0';
          pv[0].type = '\x11';
          if (sVar25 < 2) {
            local_224 = qsearch<(Nodetype)1>(pos,sVar28,(int16)local_214,0,local_1d0);
          }
          else {
            local_224 = search<(Nodetype)1>(pos,sVar28,(int16)local_214,sVar25 - 1,local_1d0);
          }
          goto LAB_0012bbe8;
        }
      }
      if (move.type == '\n') {
        std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
                  ((vector<Move,std::allocator<Move>> *)&quiets,&move);
      }
      position::undo_move(pos,&move);
      if (UCI_SIGNALS.stop != false) {
LAB_0012bd88:
        SVar26 = draw;
        goto LAB_0012bddb;
      }
      local_210 = local_210 + 1;
    } while (local_224 <= local_200);
    bestScore = local_224;
    UVar5 = move.f;
    UVar6 = move.t;
    local_21b.f = move.f;
    local_21b.t = move.t;
    local_21b.type = move.type;
    (stack->best_move).f = UVar5;
    (stack->best_move).t = UVar6;
    (stack->best_move).type = move.type;
  } while (local_224 < local_1f0);
  local_1c0 = CONCAT62(local_1c0._2_6_,(short)local_218);
  haVoc::Movehistory::update
            (&pos->stats,pos,&local_21b,&stack[-1].curr_move,(int16 *)&local_1c0,&bestScore,&quiets,
             stack->killers);
  local_200 = bestScore;
LAB_0012bcb4:
  UVar2 = (pos->ifo).key;
  uVar21 = (uint)UVar2 & 0x3ff;
  searching_positions[uVar21].searching = false;
  searching_positions[uVar21].id = -1;
  if ((local_204 <= local_200) && (local_200 < local_1f0)) {
    if (local_21b.f != local_21b.t) {
      piVar1 = stack->bestMoveHistory->bm[uVar16][local_21b.f] + local_21b.t;
      *piVar1 = *piVar1 + (int)local_1c8 * 2;
    }
  }
  if ((ushort)local_210 == 0) {
    SVar26 = draw;
    if (bVar7) {
      SVar26 = SVar22;
    }
  }
  else {
    local_1d1 = (U8)local_218;
    local_1d2 = local_200 < local_1f0;
    local_1d3 = (U8)stack->ply;
    local_1aa = (int16)local_200;
    local_1c0 = UVar2;
    hash_table::save(&ttable,&local_1c0,&local_1d1,&local_1d2,&local_1d3,&local_21b,&local_1aa,
                     &pvNode);
    SVar26 = bestScore;
  }
LAB_0012bddb:
  haVoc::Moveorder::~Moveorder(&mvs);
LAB_0012bde8:
  if (quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return SVar26;
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}